

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManTest(void)

{
  word local_18;
  word t;
  Vec_Int_t *vSets;
  
  local_18 = 0x5277;
  local_18 = Abc_Tt6Stretch(0x5277,4);
  t = (word)Dau_DecFindSets(&local_18,6);
  Vec_IntFree((Vec_Int_t *)t);
  return;
}

Assistant:

void If_DsdManTest()
{
    Vec_Int_t * vSets;
    word t = 0x5277;
    t = Abc_Tt6Stretch( t, 4 );
//    word t = 0xD9D900D900D900001010001000100000;
    vSets = Dau_DecFindSets( &t, 6 );
    Vec_IntFree( vSets );
}